

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Vector<flatbuffers::Offset<void>,unsigned_int>,unsigned_int>
          (JsonPrinter *this,uint *param_2,uint param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  char cVar1;
  int iVar2;
  long lVar3;
  IDLOptions *pIVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  
  cVar1 = '\0';
  if (param_4->base_type == BASE_TYPE_STRUCT) {
    cVar1 = param_4->struct_def->fixed;
  }
  iVar2 = this->opts->indent_step;
  iVar8 = 0;
  if (0 < iVar2) {
    iVar8 = iVar2;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  if (param_3 != 0) {
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        pIVar4 = this->opts;
        if (pIVar4->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
          pIVar4 = this->opts;
        }
        if (-1 < pIVar4->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->text,this->text->_M_string_length,0,(char)(iVar8 + param_5));
      if (cVar1 == '\0') {
        if (*param_2 <= uVar7) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset<>>::Get(SizeT) const [T = flatbuffers::Offset<>, SizeT = unsigned int]"
                       );
        }
        uVar5 = (ulong)(uint)((int)uVar7 * 4);
        lVar3 = (ulong)*(uint *)((long)param_2 + uVar5 + 4) + uVar5 + 4;
      }
      else {
        lVar3 = param_4->struct_def->bytesize * uVar7 + 4;
      }
      pcVar6 = PrintOffset(this,(void *)((long)param_2 + lVar3),param_4,iVar8 + param_5,param_6,
                           (int)uVar7);
      if (pcVar6 != (char *)0x0) {
        return pcVar6;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != param_3);
  }
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
  std::__cxx11::string::push_back((char)this->text);
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }